

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

VariableData * __thiscall
anon_unknown.dwarf_e7629::AllocateClassMember
          (anon_unknown_dwarf_e7629 *this,ExpressionContext *ctx,SynBase *source,uint alignment,
          TypeBase *type,InplaceStr name,bool readonly,uint uniqueId)

{
  Allocator *allocator;
  ScopeData *scope;
  InplaceStr name_00;
  uint offset_00;
  VariableData *this_00;
  SynIdentifier *this_01;
  undefined4 in_register_0000000c;
  TypeBase *type_00;
  undefined7 in_register_00000089;
  VariableData *variable;
  uint offset;
  bool readonly_local;
  TypeBase *type_local;
  uint alignment_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  name_00.end._1_7_ = in_register_00000089;
  name_00.end._0_1_ = readonly;
  type_00 = (TypeBase *)CONCAT44(in_register_0000000c,alignment);
  type_local._4_4_ = (uint)source;
  if (type_local._4_4_ == 0) {
    type_local._4_4_ = type_00->alignment;
  }
  offset_00 = AllocateVariableInScope
                        ((ExpressionContext *)this,(SynBase *)ctx,type_local._4_4_,type_00);
  if (((type_00->isGeneric ^ 0xffU) & 1) == 0) {
    __assert_fail("!type->isGeneric",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x339,
                  "VariableData *(anonymous namespace)::AllocateClassMember(ExpressionContext &, SynBase *, unsigned int, TypeBase *, InplaceStr, bool, unsigned int)"
                 );
  }
  this_00 = ExpressionContext::get<VariableData>((ExpressionContext *)this);
  allocator = *(Allocator **)(this + 0x8a50);
  scope = *(ScopeData **)(this + 0x8158);
  this_01 = ExpressionContext::get<SynIdentifier>((ExpressionContext *)this);
  name_00.begin = (char *)type;
  SynIdentifier::SynIdentifier(this_01,name_00);
  VariableData::VariableData
            (this_00,allocator,(SynBase *)ctx,scope,type_local._4_4_,type_00,this_01,offset_00,
             (uint)name.end);
  this_00->isReadonly = (bool)((byte)name.begin & 1);
  ExpressionContext::AddVariable((ExpressionContext *)this,this_00,true);
  return this_00;
}

Assistant:

VariableData* AllocateClassMember(ExpressionContext &ctx, SynBase *source, unsigned alignment, TypeBase *type, InplaceStr name, bool readonly, unsigned uniqueId)
	{
		if(alignment == 0)
			alignment = type->alignment;

		unsigned offset = AllocateVariableInScope(ctx, source, alignment, type);

		assert(!type->isGeneric);

		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(name), offset, uniqueId);

		variable->isReadonly = readonly;

		ctx.AddVariable(variable, true);

		return variable;
	}